

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra.c
# Opt level: O3

Byte * z7_BranchConv_RISCV_Enc(Byte *p,SizeT size,UInt32 pc)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  if ((size & 0xfffffffffffffffe) < 7) {
    return p;
  }
  iVar5 = pc - (int)p;
  puVar3 = (uint *)p;
LAB_001228d5:
  puVar4 = puVar3;
  if (p + ((size & 0xfffffffffffffffe) - 6) <= puVar4) {
    return (Byte *)puVar4;
  }
  uVar7 = ((ushort)*puVar4 ^ 0x10) + 1;
  if ((uVar7 & 0x77) != 0) goto code_r0x001228ee;
  goto LAB_0012290d;
code_r0x001228ee:
  uVar7 = (*(ushort *)((long)puVar4 + 2) ^ 0x10) + 1;
  puVar3 = puVar4 + 1;
  if ((uVar7 & 0x77) == 0) {
    puVar4 = (uint *)((long)puVar4 + 2);
    if (p + ((size & 0xfffffffffffffffe) - 6) <= puVar4) {
      return (Byte *)puVar4;
    }
LAB_0012290d:
    uVar1 = *puVar4;
    if ((uVar7 & 8) != 0) {
      if ((uVar7 & 0xe80) == 0) {
        puVar3 = puVar4 + 1;
        if ((uVar1 >> 0x1b & 0xfffffffd) <= uVar7 * 0x40000 + 0x3be00000) goto LAB_001228d5;
        uVar7 = uVar1 >> 0xc | puVar4[1] << 0x14;
        *puVar4 = (puVar4[1] & 0xfffff000) + (uVar1 >> 0x1b) * 0x80 + 0x17;
      }
      else {
        uVar2 = puVar4[1];
        if (((uVar7 << 8 ^ uVar2 + 0xffffd) & 0xf8003) != 0) {
          puVar3 = (uint *)((long)puVar4 + 6);
          goto LAB_001228d5;
        }
        *puVar4 = uVar2 << 0xc | 0x117;
        uVar7 = (uVar1 & 0xfffff000) + iVar5 + (int)puVar4 + ((int)uVar2 >> 0x14);
        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 * 0x1000000;
      }
      puVar4[1] = uVar7;
      puVar3 = puVar4 + 2;
      goto LAB_001228d5;
    }
    if ((uVar7 + 0xf00 & 0xd80) == 0) {
      uVar7 = (uVar1 & 0xff000 | uVar1 >> 0x14 & 0x7fe | uVar1 >> 0xb & 0x100000 |
              uVar1 >> 9 & 0x800) + iVar5 + (int)puVar4;
      *(byte *)((long)puVar4 + 1) = (byte)(uVar1 >> 8) & 0xf | (byte)(uVar7 >> 0xd) & 0xf0;
      iVar6 = uVar7 * 0x8000;
      *(ushort *)((long)puVar4 + 2) =
           (ushort)(byte)((uint)iVar6 >> 0x18) | (ushort)((uint)iVar6 >> 8) & 0xff00;
      puVar3 = puVar4 + 1;
    }
    else {
      puVar3 = (uint *)((long)puVar4 + 2);
    }
  }
  goto LAB_001228d5;
}

Assistant:

Byte * Z7_BRANCH_CONV_ENC(RISCV)(Byte *p, SizeT size, UInt32 pc)
{
  RISCV_SCAN_LOOP
    v = a;
    a = RISCV_GET_UI32(p);
#ifndef RISCV_USE_16BIT_LOAD
    v += (UInt32)p[1] << 8;
#endif

    if ((v & 8) == 0) // JAL
    {
      if ((v - (0x100 /* - RISCV_DELTA_7F */)) & 0xd80)
      {
        p += RISCV_INSTR_SIZE;
        continue;
      }
      {
        v = ((a &    1u << 31) >> 11)
          | ((a & 0x3ff << 21) >> 20)
          | ((a &     1 << 20) >> 9)
          |  (a &  0xff << 12);
        BR_CONVERT_VAL_ENC(v)
        // ((v & 1) == 0)
        // v: bits [1 : 20] contain offset bits
#if 0 && defined(RISCV_USE_UNALIGNED_LOAD)
        a &= 0xfff;
        a |= ((UInt32)(v << 23))
          |  ((UInt32)(v <<  7) & ((UInt32)0xff << 16))
          |  ((UInt32)(v >>  5) & ((UInt32)0xf0 << 8));
        RISCV_SET_UI32(p, a)
#else // aligned
#if 0
        SetUi16a(p, (UInt16)(((v >> 5) & 0xf000) | (a & 0xfff)))
#else
        p[1] = (Byte)(((v >> 13) & 0xf0) | ((a >> 8) & 0xf));
#endif

#if 1 && defined(Z7_CPU_FAST_BSWAP_SUPPORTED) && defined(MY_CPU_LE)
        v <<= 15;
        v = Z7_BSWAP32(v);
        SetUi16a(p + 2, (UInt16)v)
#else
        p[2] = (Byte)(v >> 9);
        p[3] = (Byte)(v >> 1);
#endif
#endif // aligned
      }
      p += 4;
      continue;
    } // JAL

    {
      // AUIPC
      if (v & 0xe80)  // (not x0) and (not x2)
      {
        const UInt32 b = RISCV_GET_UI32(p + 4);
        if (RISCV_CHECK_1(v, b))
        {
          {
            const UInt32 temp = (b << 12) | (0x17 + RISCV_REG_VAL);
            RISCV_SET_UI32(p, temp)
          }
          a &= 0xfffff000;
          {
#if 1
          const int t = -1 >> 1;
          if (t != -1)
            a += (b >> 20) - ((b >> 19) & 0x1000); // arithmetic right shift emulation
          else
#endif
            a += (UInt32)((Int32)b >> 20); // arithmetic right shift (sign-extension).
          }
          BR_CONVERT_VAL_ENC(a)
#if 1 && defined(Z7_CPU_FAST_BSWAP_SUPPORTED) && defined(MY_CPU_LE)
          a = Z7_BSWAP32(a);
          RISCV_SET_UI32(p + 4, a)
#else
          SetBe32(p + 4, a)
#endif
          p += 8;
        }
        else
          p += RISCV_STEP_1;
      }
      else
      {
        UInt32 r = a >> 27;
        if (RISCV_CHECK_2(v, r))
        {
          v = RISCV_GET_UI32(p + 4);
          r = (r << 7) + 0x17 + (v & 0xfffff000);
          a = (a >> 12) | (v << 20);
          RISCV_SET_UI32(p, r)
          RISCV_SET_UI32(p + 4, a)
          p += 8;
        }
        else
          p += RISCV_STEP_2;
      }
    }
  }